

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O0

int getflag(int argc,char **argv,char *flags)

{
  int pos1;
  int __c;
  char *pcVar1;
  bool bVar2;
  char *flagp;
  int local_28;
  int c;
  int flagstart;
  int argstart;
  char *flags_local;
  char **argv_local;
  int argc_local;
  
  pos1 = flagind;
  flagp._4_4_ = -1;
  flagarg = (char *)0x0;
  while( true ) {
    bVar2 = false;
    if (flagind < argc) {
      bVar2 = *argv[flagind] != '-';
    }
    if (!bVar2) break;
    flagind = flagind + 1;
  }
  if (flagind == argc) {
    argv_local._4_4_ = -1;
    flagind = pos1;
  }
  else {
    local_28 = flagind;
    if ((argv[flagind][1] != '-') || (argv[flagind][2] != '\0')) {
      __c = (int)argv[flagind][1];
      flagflag = __c;
      if ((__c == 0x3a) || (__c == 0)) {
        flagp._4_4_ = 0x3f;
      }
      else {
        if (argv[flagind][2] != '\0') {
          flagarg = argv[flagind] + 2;
        }
        pcVar1 = strchr(flags,__c);
        if (pcVar1 == (char *)0x0) {
          flagp._4_4_ = 0x3f;
        }
        else {
          flagp._4_4_ = __c;
          if ((flagarg == (char *)0x0) && (pcVar1[1] == ':')) {
            if (flagind + 1 == argc) {
              local_28 = pos1;
              flagp._4_4_ = 0x3f;
            }
            else {
              flagind = flagind + 1;
              flagarg = argv[flagind];
            }
          }
          else if ((flagarg != (char *)0x0) && (pcVar1[1] != ':')) {
            flagp._4_4_ = 0x3f;
          }
        }
      }
    }
    flagind = flagind + 1;
    if ((local_28 < flagind) && (pos1 < local_28)) {
      reverse(argv,pos1,local_28);
      reverse(argv,local_28,flagind);
      reverse(argv,pos1,flagind);
    }
    flagind = (pos1 + flagind) - local_28;
    argv_local._4_4_ = flagp._4_4_;
  }
  return argv_local._4_4_;
}

Assistant:

int getflag(int argc, char **argv, const char *flags)
{
    int argstart, flagstart, c;
    const char *flagp;

    c = -1;
    flagarg = NULL;
    argstart = flagind;
    flagstart = argc;

    /* skip over non-flags */
    while (flagind < argc && argv[flagind][0] != '-')
    {
        ++flagind;
    }
    if (flagind == argc)
    {
        /* no more args */
        flagind = argstart;
        return c;
    }
    /* we have an arg to work with */
    do
    {
        flagstart = flagind;
        if (argv[flagind][1] == '-' && argv[flagind][2] == '\0')
        {
            /* stop parsing at '--' flag */
            break;
        }
        c = flagflag = argv[flagind][1];
        if (c == ':' || c == '\0')
        {
            /* this is an illegal flag */
            c = '?';
            break;
        }
        /* flag with arg */
        if (argv[flagind][2] != '\0')
        {
            /* flag-arg in same argv[] */
            flagarg = argv[flagind] + 2;
        }
        flagp = strchr(flags, c);
        if (flagp == NULL)
        {
            /* this is an unknown flag */
            c = '?';
            break;
        }
        if (flagarg != NULL || flagp[1] != ':')
        {
            if (flagarg != NULL && flagp[1] != ':')
            {
                /* error, a simple flag with an argument */
                c = '?';
            }
            break;
        }

        /* flag-arg is in the next argv[] */
        if (flagind + 1 == argc)
        {
            /* auahh, no flag-arg */
            flagstart = argstart;
            c = '?';
            break;
        }
        flagarg = argv[++flagind];
    } while (0);
    /* skip to next arg */
    ++flagind;

    if (flagstart < flagind && argstart < flagstart)
    {
        /* we have found some args
         * we have also skipped over some non-args
         * shuffle the non-flag arg to the end of argv */
        reverse(argv, argstart, flagstart);
        reverse(argv, flagstart, flagind);
        reverse(argv, argstart, flagind);
    }
    flagind = argstart + flagind - flagstart;

    return c;
}